

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyTable.cpp
# Opt level: O0

Var Js::WebAssemblyTable::EntrySet(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags e;
  BOOL BVar3;
  uint32 uVar4;
  ScriptContext *pSVar5;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar6;
  Var pvVar7;
  WebAssemblyTable *pWVar8;
  Var aValue;
  WriteBarrierPtr<void> **ppWVar9;
  JavascriptLibrary *this_00;
  RecyclableObject *pRVar10;
  Var pvStack_60;
  uint32 index;
  Var value;
  Var indexVar;
  WebAssemblyTable *table;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar5 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar5);
  pSVar5 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar5,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyTable.cpp"
                                ,0xa1,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  pSVar5 = RecyclableObject::GetScriptContext(function);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyTable.cpp"
                                ,0xa4,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (((ulong)scriptContext & 0xffffff) != 0) {
    pvVar7 = Arguments::operator[]((Arguments *)&scriptContext,0);
    bVar2 = VarIs<Js::WebAssemblyTable>(pvVar7);
    if (bVar2) {
      pvVar7 = Arguments::operator[]((Arguments *)&scriptContext,0);
      pWVar8 = VarTo<Js::WebAssemblyTable>(pvVar7);
      if (((uint)scriptContext & 0xffffff) < 3) {
        JavascriptError::ThrowTypeError(pSVar5,-0x7ff5e49b,(PCWSTR)0x0);
      }
      pvVar7 = Arguments::operator[]((Arguments *)&scriptContext,1);
      pvStack_60 = Arguments::operator[]((Arguments *)&scriptContext,2);
      BVar3 = Js::JavascriptOperators::IsNull(pvStack_60);
      if (BVar3 == 0) {
        aValue = Arguments::operator[]((Arguments *)&scriptContext,2);
        bVar2 = VarIs<Js::WasmScriptFunction>(aValue);
        if (!bVar2) {
          JavascriptError::ThrowTypeError(pSVar5,-0x7ff5e49b,(PCWSTR)0x0);
        }
      }
      else {
        pvStack_60 = (void *)0x0;
      }
      uVar4 = WebAssembly::ToNonWrappingUint32(pvVar7,pSVar5);
      if (uVar4 < pWVar8->m_currentLength) {
        ppWVar9 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                            ((WriteBarrierPtr *)&pWVar8->m_values);
        Memory::WriteBarrierPtr<void>::operator=(*ppWVar9 + uVar4,pvStack_60);
        this_00 = ScriptContext::GetLibrary(pSVar5);
        pRVar10 = JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
        return pRVar10;
      }
      JavascriptError::ThrowRangeError(pSVar5,-0x7ff5ebf6,(PCWSTR)0x0);
    }
  }
  JavascriptError::ThrowTypeError(pSVar5,-0x7ff5e49c,(PCWSTR)0x0);
}

Assistant:

Var
WebAssemblyTable::EntrySet(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    Assert(!(callInfo.Flags & CallFlags_New));

    if (args.Info.Count == 0 || !VarIs<WebAssemblyTable>(args[0]))
    {
        JavascriptError::ThrowTypeError(scriptContext, WASMERR_NeedTableObject);
    }
    WebAssemblyTable * table = VarTo<WebAssemblyTable>(args[0]);

    if (args.Info.Count < 3)
    {
        JavascriptError::ThrowTypeError(scriptContext, WASMERR_NeedWebAssemblyFunc);
    }
    Var indexVar = args[1];
    Var value = args[2];

    if (JavascriptOperators::IsNull(value))
    {
        value = nullptr;
    }
    else if (!VarIs<WasmScriptFunction>(args[2]))
    {
        JavascriptError::ThrowTypeError(scriptContext, WASMERR_NeedWebAssemblyFunc);
    }

    uint32 index = WebAssembly::ToNonWrappingUint32(indexVar, scriptContext);
    if (index >= table->m_currentLength)
    {
        JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgumentOutOfRange);
    }

    table->m_values[index] = value;

    return scriptContext->GetLibrary()->GetUndefined();
}